

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsemulatorintegration.cpp
# Opt level: O2

void __thiscall QEglFSEmulatorIntegration::screenInit(QEglFSEmulatorIntegration *this)

{
  char cVar1;
  bool bVar2;
  QEglFSEmulatorScreen *this_00;
  ulong uVar3;
  long in_FS_OFFSET;
  iterator iVar4;
  iterator iVar5;
  QJsonArray screenArray;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 local_7c;
  char *local_78;
  QJsonObject local_70 [8];
  QJsonDocument displaysDocument;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->getDisplays == (PFNQGSGETDISPLAYSPROC)0x0) {
    local_90._0_4_ = 2;
    local_7c = 0;
    local_90._4_4_ = 0;
    uStack_88 = 0;
    uStack_84 = 0;
    uStack_80 = 0;
    local_78 = "default";
    QMessageLogger::fatal((char *)&local_90,"EGL library doesn\'t support Emulator extensions");
  }
  else {
    local_58.size = -0x5555555555555556;
    local_58.d._0_4_ = 0xaaaaaaaa;
    local_58.d._4_4_ = 0xaaaaaaaa;
    local_58.ptr._0_4_ = 0xaaaaaaaa;
    local_58.ptr._4_4_ = 0xaaaaaaaa;
    (*this->getDisplays)((QByteArray *)&local_58);
    _displaysDocument = 0xaaaaaaaaaaaaaaaa;
    QJsonDocument::fromJson((QByteArray *)&displaysDocument,(QJsonParseError *)&local_58);
    cVar1 = QJsonDocument::isArray();
    if (cVar1 != '\0') {
      _screenArray = 0xaaaaaaaaaaaaaaaa;
      QJsonDocument::array();
      iVar4 = QJsonArray::begin(&screenArray);
      iVar5 = QJsonArray::end(&screenArray);
      for (uVar3 = iVar4.item.super_QJsonValueConstRef._8_8_;
          (iVar4.item.super_QJsonValueConstRef.field_0.a !=
           iVar5.item.super_QJsonValueConstRef.field_0.a ||
          (1 < (uVar3 ^ iVar5.item.super_QJsonValueConstRef._8_8_))); uVar3 = uVar3 + 2) {
        local_90._0_4_ = iVar4.item.super_QJsonValueConstRef.field_0._0_4_;
        local_90._4_4_ = iVar4.item.super_QJsonValueConstRef.field_0._4_4_;
        uStack_88 = (undefined4)uVar3;
        uStack_84 = (undefined4)(uVar3 >> 0x20);
        bVar2 = QJsonValueRef::isObject((QJsonValueRef *)&local_90);
        if (bVar2) {
          this_00 = (QEglFSEmulatorScreen *)operator_new(0x78);
          QJsonValueRef::toObject();
          QEglFSEmulatorScreen::QEglFSEmulatorScreen(this_00,local_70);
          QWindowSystemInterface::handleScreenAdded((QPlatformScreen *)this_00,false);
          QJsonObject::~QJsonObject(local_70);
        }
      }
      QJsonArray::~QJsonArray(&screenArray);
    }
    QJsonDocument::~QJsonDocument(&displaysDocument);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSEmulatorIntegration::screenInit()
{
    // Use qgsGetDisplays() call to retrieve the available screens from the Emulator
    if (getDisplays) {
        QByteArray displaysInfo = getDisplays();
        QJsonParseError error;
        QJsonDocument displaysDocument = QJsonDocument::fromJson(displaysInfo, &error);
        if (error.error == QJsonParseError::NoError) {
            // Document should be an array of screen objects
            if (displaysDocument.isArray()){
                QJsonArray screenArray = displaysDocument.array();
                for (auto screenValue : screenArray) {
                    if (screenValue.isObject())
                        QWindowSystemInterface::handleScreenAdded(new QEglFSEmulatorScreen(screenValue.toObject()));
                }
            }
        } else {
            qWarning() << "eglfs_emu: Failed to parse display info JSON with error: " << error.errorString()
                       << " at offset " << error.offset << " : " << displaysInfo;

        }
    } else {
        qFatal("EGL library doesn't support Emulator extensions");
    }
}